

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O3

LY_ERR lyd_new_inner(lyd_node *parent,lys_module *module,char *name,ly_bool output,lyd_node **node)

{
  LY_ERR LVar1;
  lys_module *plVar2;
  ly_ctx *ctx;
  size_t prefix_len;
  size_t name_len;
  lysc_node *parent_00;
  ly_ctx *ctx_00;
  char *pcVar3;
  lyd_node *ret;
  lysc_ext_instance *ext;
  lysc_node *schema;
  
  ret = (lyd_node *)0x0;
  ext = (lysc_ext_instance *)0x0;
  if (parent == (lyd_node *)0x0) {
    if (module == (lys_module *)0x0) {
      pcVar3 = "parent || module";
      ctx_00 = (ly_ctx *)0x0;
      goto LAB_0012aefc;
    }
    ctx_00 = module->ctx;
    if (node == (lyd_node **)0x0) {
      pcVar3 = "parent || node";
      goto LAB_0012aefc;
    }
    if (name != (char *)0x0) goto LAB_0012aeba;
  }
  else {
    if (parent->schema == (lysc_node *)0x0) {
      plVar2 = (lys_module *)&parent[2].schema;
    }
    else {
      plVar2 = parent->schema->module;
    }
    ctx_00 = plVar2->ctx;
    if (name != (char *)0x0) {
      if (parent == (lyd_node *)0x0) {
        parent_00 = _DAT_00000008;
        if (module != (lys_module *)0x0) {
LAB_0012aeba:
          parent_00 = (lysc_node *)0x0;
          goto LAB_0012af83;
        }
      }
      else {
        parent_00 = parent->schema;
        if (parent_00 == (lysc_node *)0x0) {
          ctx = (ly_ctx *)parent[2].schema;
          if ((ctx != (ly_ctx *)0x0 && module != (lys_module *)0x0) &&
             (ctx != module->ctx && module->ctx != (ly_ctx *)0x0)) goto LAB_0012af53;
        }
        else if ((module != (lys_module *)0x0) &&
                (((ctx = parent_00->module->ctx, ctx != (ly_ctx *)0x0 &&
                  (module->ctx != (ly_ctx *)0x0)) && (ctx != module->ctx)))) {
LAB_0012af53:
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
        if (module != (lys_module *)0x0) goto LAB_0012af83;
      }
      module = parent_00->module;
LAB_0012af83:
      schema = lys_find_child(parent_00,module,name,0,0x701,(uint)(output != '\0') << 4);
      if ((parent != (lyd_node *)0x0) && (schema == (lysc_node *)0x0)) {
        pcVar3 = module->name;
        prefix_len = strlen(pcVar3);
        name_len = strlen(name);
        LVar1 = ly_nested_ext_schema
                          (parent,(lysc_node *)0x0,pcVar3,prefix_len,LY_VALUE_JSON,(void *)0x0,name,
                           name_len,&schema,&ext);
        if ((LVar1 != LY_ENOT) && (LVar1 != LY_SUCCESS)) {
          return LVar1;
        }
      }
      if (schema == (lysc_node *)0x0) {
        ly_log(ctx_00,LY_LLERR,LY_EINVAL,
               "Inner node (container, notif, RPC, or action) \"%s\" not found.",name);
        return LY_ENOTFOUND;
      }
      LVar1 = lyd_create_inner(schema,&ret);
      if (LVar1 != LY_SUCCESS) {
        return LY_EMEM;
      }
      if (ext != (lysc_ext_instance *)0x0) {
        ret->flags = ret->flags | 8;
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,ret,0);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = ret;
      return LY_SUCCESS;
    }
  }
  pcVar3 = "name";
LAB_0012aefc:
  ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lyd_new_inner");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_inner(struct lyd_node *parent, const struct lys_module *module, const char *name, ly_bool output,
        struct lyd_node **node)
{
    LY_ERR r;
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct lysc_ext_instance *ext = NULL;
    const struct ly_ctx *ctx = parent ? LYD_CTX(parent) : (module ? module->ctx : NULL);

    LY_CHECK_ARG_RET(ctx, parent || module, parent || node, name, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(parent ? LYD_CTX(parent) : NULL, module ? module->ctx : NULL, LY_EINVAL);

    if (!module) {
        module = parent->schema->module;
    }

    schema = lys_find_child(parent ? parent->schema : NULL, module, name, 0,
            LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION, output ? LYS_GETNEXT_OUTPUT : 0);
    if (!schema && parent) {
        r = ly_nested_ext_schema(parent, NULL, module->name, strlen(module->name), LY_VALUE_JSON, NULL, name,
                strlen(name), &schema, &ext);
        LY_CHECK_RET(r && (r != LY_ENOT), r);
    }
    LY_CHECK_ERR_RET(!schema, LOGERR(ctx, LY_EINVAL, "Inner node (container, notif, RPC, or action) \"%s\" not found.",
            name), LY_ENOTFOUND);

    LY_CHECK_RET(lyd_create_inner(schema, &ret));
    if (ext) {
        ret->flags |= LYD_EXT;
    }
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_DEFAULT);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}